

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O1

void BMP_SetPixelRGB(BMP *bmp,unsigned_long x,unsigned_long y,uchar r,uchar g,uchar b)

{
  ushort uVar1;
  ulong uVar2;
  uchar *puVar3;
  long lVar4;
  long lVar5;
  
  if (((bmp != (BMP *)0x0) && (x < (bmp->Header).Width)) &&
     (uVar2 = (bmp->Header).Height, y < uVar2)) {
    uVar1 = (bmp->Header).BitsPerPixel;
    if ((uVar1 == 0x18) || (uVar1 == 0x20)) {
      BMP_LAST_ERROR_CODE = BMP_OK;
      lVar5 = (~y + uVar2) * ((bmp->Header).ImageDataSize / uVar2);
      puVar3 = bmp->Data;
      lVar4 = (uVar1 >> 3 & 0xff) * x;
      puVar3[lVar4 + 2 + lVar5] = r;
      puVar3[lVar4 + 1 + lVar5] = g;
      puVar3[lVar4 + lVar5] = b;
    }
    else {
      BMP_LAST_ERROR_CODE = BMP_TYPE_MISMATCH;
    }
    return;
  }
  BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
  return;
}

Assistant:

void BMP_SetPixelRGB( BMP* bmp, UINT x, UINT y, UCHAR r, UCHAR g, UCHAR b )
{
	UCHAR*	pixel;
	UINT	bytes_per_row;
	UCHAR	bytes_per_pixel;

	if ( bmp == NULL || x < 0 || x >= bmp->Header.Width || y < 0 || y >= bmp->Header.Height )
	{
		BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
	}

	else if ( bmp->Header.BitsPerPixel != 24 && bmp->Header.BitsPerPixel != 32 )
	{
		BMP_LAST_ERROR_CODE = BMP_TYPE_MISMATCH;
	}

	else
	{
		BMP_LAST_ERROR_CODE = BMP_OK;

		bytes_per_pixel = bmp->Header.BitsPerPixel >> 3;

		/* Row's size is rounded up to the next multiple of 4 bytes */
		bytes_per_row = bmp->Header.ImageDataSize / bmp->Header.Height;

		/* Calculate the location of the relevant pixel (rows are flipped) */
		pixel = bmp->Data + ( ( bmp->Header.Height - y - 1 ) * bytes_per_row + x * bytes_per_pixel );

		/* Note: colors are stored in BGR order */
		*( pixel + 2 ) = r;
		*( pixel + 1 ) = g;
		*( pixel + 0 ) = b;
	}
}